

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_strndup(char *s,size_t n)

{
  size_t __n;
  char *tmp;
  size_t l;
  size_t n_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    __n = strnlen(s,n);
    s_local = (char *)malloc(__n + 1);
    if (s_local == (char *)0x0) {
      s_local = (char *)0x0;
    }
    else {
      memcpy(s_local,s,__n);
      s_local[__n] = '\0';
    }
  }
  return s_local;
}

Assistant:

char*
bc_strndup(const char *s, size_t n)
{
    if (s == NULL)
        return NULL;
    size_t l = strnlen(s, n);
    char *tmp = malloc(l + 1);
    if (tmp == NULL)
        return NULL;
    memcpy(tmp, s, l);
    tmp[l] = '\0';
    return tmp;
}